

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd_test.c
# Opt level: O0

void test_sfd_accept_multi(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  undefined4 uVar5;
  nng_err result__23;
  nng_err result__22;
  nng_err result__21;
  int rv__1;
  size_t sz__1;
  char buf__1 [64];
  ulong uStack_d0;
  int rv_;
  size_t sz_;
  char buf_ [64];
  nng_err result__20;
  nng_err result__19;
  nng_err result__18;
  nng_err result__17;
  nng_err result__16;
  nng_err result__15;
  nng_err result__14;
  nng_err result__13;
  nng_err result__12;
  nng_err result__11;
  nng_err result__10;
  nng_err result__9;
  nng_err result__8;
  nng_err result__7;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  int fds2 [2];
  int fds1 [2];
  nng_listener l3;
  nng_listener l2;
  nng_listener l1;
  nng_socket s3;
  nng_socket s2;
  nng_socket s1;
  
  nVar1 = nng_socket_pair(fds2);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x67,"%s: expected success, got %s (%d)","nng_socket_pair(fds1)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_pair((int *)&result__1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x68,"%s: expected success, got %s (%d)","nng_socket_pair(fds2)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_pub0_open(&s3);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x69,"%s: expected success, got %s (%d)","nng_pub0_open(&s1)",pcVar3,nVar1
                        );
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_sub0_open((nng_socket *)&l1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x6a,"%s: expected success, got %s (%d)","nng_sub0_open(&s2)",pcVar3,nVar1
                        );
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_sub0_open((nng_socket *)&l2);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x6b,"%s: expected success, got %s (%d)","nng_sub0_open(&s3)",pcVar3,nVar1
                        );
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms(s3,"send-timeout",1000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x6c,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 1000)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms((nng_socket)l1.id,"recv-timeout",1000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x6d,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 1000)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms((nng_socket)l2.id,"recv-timeout",1000);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x6e,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(s3, NNG_OPT_RECVTIMEO, 1000)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_sub0_socket_subscribe((nng_socket)l1.id,(void *)0x0,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x6f,"%s: expected success, got %s (%d)",
                         "nng_sub0_socket_subscribe(s2, NULL, 0)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_sub0_socket_subscribe((nng_socket)l2.id,(void *)0x0,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x70,"%s: expected success, got %s (%d)",
                         "nng_sub0_socket_subscribe(s3, NULL, 0)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_listener_create(&l3,s3,"socket://");
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x72,"%s: expected success, got %s (%d)",
                         "nng_listener_create(&l1, s1, \"socket://\")",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_listener_create((nng_listener *)(fds1 + 1),(nng_socket)l1.id,"socket://");
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x73,"%s: expected success, got %s (%d)",
                         "nng_listener_create(&l2, s2, \"socket://\")",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_listener_create((nng_listener *)fds1,(nng_socket)l2.id,"socket://");
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x74,"%s: expected success, got %s (%d)",
                         "nng_listener_create(&l3, s3, \"socket://\")",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_listener_start(l3,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x75,"%s: expected success, got %s (%d)","nng_listener_start(l1, 0)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_listener_start((nng_listener)fds1[1],0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x76,"%s: expected success, got %s (%d)","nng_listener_start(l2, 0)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_listener_start((nng_listener)fds1[0],0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x77,"%s: expected success, got %s (%d)","nng_listener_start(l3, 0)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_listener_set_int(l3,"socket:fd",fds2[0]);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x78,"%s: expected success, got %s (%d)",
                         "nng_listener_set_int(l1, NNG_OPT_SOCKET_FD, fds1[0])",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_listener_set_int((nng_listener)fds1[1],"socket:fd",fds2[1]);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x79,"%s: expected success, got %s (%d)",
                         "nng_listener_set_int(l2, NNG_OPT_SOCKET_FD, fds1[1])",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_listener_set_int(l3,"socket:fd",result__1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x7a,"%s: expected success, got %s (%d)",
                         "nng_listener_set_int(l1, NNG_OPT_SOCKET_FD, fds2[0])",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_listener_set_int((nng_listener)fds1[0],"socket:fd",result_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x7b,"%s: expected success, got %s (%d)",
                         "nng_listener_set_int(l3, NNG_OPT_SOCKET_FD, fds2[1])",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nng_msleep(200);
  buf_._60_4_ = nng_send(s3,"ping",5,0);
  bVar4 = buf_._60_4_ == NNG_OK;
  pcVar3 = nng_strerror(buf_._60_4_);
  uVar5 = buf_._60_4_;
  iVar2 = acutest_check_((uint)bVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x7d,"%s: expected success, got %s (%d)",
                         "nng_send(s1, \"ping\", strlen(\"ping\") + 1, 0)",pcVar3,buf_._60_4_);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  uStack_d0 = 0x40;
  nVar1 = nng_recv((nng_socket)l1.id,&sz_,&stack0xffffffffffffff30,0);
  buf__1._60_4_ = nVar1;
  pcVar3 = nng_strerror(nVar1);
  acutest_check_((uint)(nVar1 == NNG_OK),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                 ,0x7e,"nng_recv (%d %s)",(ulong)nVar1,pcVar3,uVar5);
  acutest_check_((uint)(uStack_d0 == 5),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                 ,0x7e,"length %d want %d",uStack_d0 & 0xffffffff,5);
  buf_[0x37] = '\0';
  iVar2 = strcmp("ping",(char *)&sz_);
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                 ,0x7e,"%s == %s","ping",&sz_);
  _result__21 = 0x40;
  nVar1 = nng_recv((nng_socket)l2.id,&sz__1,(size_t *)&result__21,0);
  pcVar3 = nng_strerror(nVar1);
  acutest_check_((uint)(nVar1 == NNG_OK),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                 ,0x7f,"nng_recv (%d %s)",(ulong)nVar1,pcVar3);
  acutest_check_((uint)(_result__21 == 5),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                 ,0x7f,"length %d want %d",_result__21 & 0xffffffff,5);
  buf__1[0x37] = '\0';
  iVar2 = strcmp("ping",(char *)&sz__1);
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                 ,0x7f,"%s == %s","ping",&sz__1);
  nVar1 = nng_socket_close(s3);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x80,"%s: expected success, got %s (%d)","nng_socket_close(s1)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_close((nng_socket)l1.id);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x81,"%s: expected success, got %s (%d)","nng_socket_close(s2)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_close((nng_socket)l2.id);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x82,"%s: expected success, got %s (%d)","nng_socket_close(s3)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  return;
}

Assistant:

void
test_sfd_accept_multi(void)
{
#ifdef NNG_HAVE_SOCKETPAIR
	nng_socket   s1, s2, s3;
	nng_listener l1, l2, l3;
	int          fds1[2];
	int          fds2[2];

	NUTS_PASS(nng_socket_pair(fds1));
	NUTS_PASS(nng_socket_pair(fds2));
	NUTS_PASS(nng_pub0_open(&s1));
	NUTS_PASS(nng_sub0_open(&s2));
	NUTS_PASS(nng_sub0_open(&s3));
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 1000));
	NUTS_PASS(nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 1000));
	NUTS_PASS(nng_socket_set_ms(s3, NNG_OPT_RECVTIMEO, 1000));
	NUTS_PASS(nng_sub0_socket_subscribe(s2, NULL, 0));
	NUTS_PASS(nng_sub0_socket_subscribe(s3, NULL, 0));

	NUTS_PASS(nng_listener_create(&l1, s1, "socket://"));
	NUTS_PASS(nng_listener_create(&l2, s2, "socket://"));
	NUTS_PASS(nng_listener_create(&l3, s3, "socket://"));
	NUTS_PASS(nng_listener_start(l1, 0));
	NUTS_PASS(nng_listener_start(l2, 0));
	NUTS_PASS(nng_listener_start(l3, 0));
	NUTS_PASS(nng_listener_set_int(l1, NNG_OPT_SOCKET_FD, fds1[0]));
	NUTS_PASS(nng_listener_set_int(l2, NNG_OPT_SOCKET_FD, fds1[1]));
	NUTS_PASS(nng_listener_set_int(l1, NNG_OPT_SOCKET_FD, fds2[0]));
	NUTS_PASS(nng_listener_set_int(l3, NNG_OPT_SOCKET_FD, fds2[1]));
	nng_msleep(200);
	NUTS_SEND(s1, "ping");
	NUTS_RECV(s2, "ping");
	NUTS_RECV(s3, "ping");
	NUTS_CLOSE(s1);
	NUTS_CLOSE(s2);
	NUTS_CLOSE(s3);
#else
	NUTS_SKIP("no socketpair");
#endif
}